

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::getBasisTransposeSolve
          (Highs *this,double *Xrhs,double *solution_vector,HighsInt *solution_num_nz,
          HighsInt *solution_indices)

{
  reference pvVar1;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  HighsInt row;
  vector<double,_std::allocator<double>_> rhs;
  HighsInt num_row;
  bool in_stack_00000067;
  HighsInt *in_stack_00000068;
  HighsInt *in_stack_00000070;
  double *in_stack_00000078;
  vector<double,_std::allocator<double>_> *in_stack_00000080;
  size_type in_stack_ffffffffffffff48;
  value_type vVar2;
  vector<double,_std::allocator<double>_> *this_00;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff60;
  Highs *this_01;
  int local_8c;
  vector<double,_std::allocator<double>_> local_80;
  int local_68;
  undefined1 local_51 [57];
  long local_18;
  HighsStatus local_4;
  
  if (in_RSI == 0) {
    highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,"getBasisTransposeSolve: Xrhs is NULL\n"
                );
    local_4 = kError;
  }
  else if (in_RDX == 0) {
    highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                 "getBasisTransposeSolve: solution_vector is NULL\n");
    local_4 = kError;
  }
  else if ((*(byte *)(in_RDI + 0x3850) & 1) == 0) {
    this_01 = (Highs *)local_51;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_51 + 1),"getBasisTransposeSolve",(allocator *)this_01);
    local_4 = invertRequirementError
                        (this_01,(string *)
                                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    std::__cxx11::string::~string((string *)(local_51 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_51);
  }
  else {
    local_68 = *(int *)(in_RDI + 0x13c);
    this_00 = &local_80;
    local_18 = in_RSI;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x48fed5);
    std::vector<double,_std::allocator<double>_>::assign
              (this_00,in_stack_ffffffffffffff48,(value_type_conflict1 *)0x48fef2);
    for (local_8c = 0; local_8c < local_68; local_8c = local_8c + 1) {
      vVar2 = *(value_type *)(local_18 + (long)local_8c * 8);
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](&local_80,(long)local_8c);
      *pvVar1 = vVar2;
    }
    basisSolveInterface((Highs *)solution_indices,in_stack_00000080,in_stack_00000078,
                        in_stack_00000070,in_stack_00000068,in_stack_00000067);
    local_4 = kOk;
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff60);
  }
  return local_4;
}

Assistant:

HighsStatus Highs::getBasisTransposeSolve(const double* Xrhs,
                                          double* solution_vector,
                                          HighsInt* solution_num_nz,
                                          HighsInt* solution_indices) {
  if (Xrhs == NULL) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "getBasisTransposeSolve: Xrhs is NULL\n");
    return HighsStatus::kError;
  }
  if (solution_vector == NULL) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "getBasisTransposeSolve: solution_vector is NULL\n");
    return HighsStatus::kError;
  }
  // solution_indices can be NULL - it's the trigger that determines
  // whether they are identified or not
  if (!ekk_instance_.status_.has_invert)
    return invertRequirementError("getBasisTransposeSolve");
  HighsInt num_row = model_.lp_.num_row_;
  vector<double> rhs;
  rhs.assign(num_row, 0);
  for (HighsInt row = 0; row < num_row; row++) rhs[row] = Xrhs[row];
  basisSolveInterface(rhs, solution_vector, solution_num_nz, solution_indices,
                      true);
  return HighsStatus::kOk;
}